

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O0

string * __thiscall
google::protobuf::StrCat_abi_cxx11_(string *__return_storage_ptr__,protobuf *this,AlphaNum *a)

{
  char *pcVar1;
  size_t sVar2;
  allocator local_19;
  AlphaNum *local_18;
  AlphaNum *a_local;
  
  local_18 = (AlphaNum *)this;
  a_local = (AlphaNum *)__return_storage_ptr__;
  pcVar1 = strings::AlphaNum::data((AlphaNum *)this);
  sVar2 = strings::AlphaNum::size(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,sVar2,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

inline string StrCat(const AlphaNum& a) { return string(a.data(), a.size()); }